

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_ldm_fillHashTable
               (ldmState_t *ldmState,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  BYTE *pBVar1;
  uint uVar2;
  BYTE *pBVar3;
  unsigned_long_long uVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  BYTE *pBVar10;
  uint numSplits;
  ldmRollingHashState_t hashState;
  uint local_78;
  uint local_74;
  BYTE *local_70;
  size_t local_68;
  long local_60;
  ulong local_58;
  BYTE *local_50;
  ldmParams_t *local_48;
  ldmRollingHashState_t local_40;
  
  uVar2 = params->minMatchLength;
  local_50 = (ldmState->window).base;
  uVar9 = 0x40;
  if (uVar2 < 0x40) {
    uVar9 = uVar2;
  }
  bVar5 = (byte)params->hashRateLog;
  bVar6 = 0;
  if (params->hashRateLog - 1 < uVar9) {
    bVar6 = (char)uVar9 - bVar5;
  }
  local_40.stopMask = ~(-1L << (bVar5 & 0x3f)) << (bVar6 & 0x3f);
  local_40.rolling = 0xffffffff;
  if (ip < iend) {
    local_58 = (ulong)uVar2;
    pBVar1 = ip + local_58;
    local_60 = -local_58;
    local_74 = ~(-1 << ((char)params->hashLog - (char)params->bucketSizeLog & 0x1fU));
    local_70 = iend;
    local_48 = params;
    do {
      local_78 = 0;
      local_68 = ZSTD_ldm_gear_feed(&local_40,ip,(long)local_70 - (long)ip,ldmState->splitIndices,
                                    &local_78);
      if (local_78 != 0) {
        uVar8 = 0;
        do {
          pBVar10 = ip + ldmState->splitIndices[uVar8];
          if (pBVar1 <= pBVar10) {
            pBVar10 = pBVar10 + local_60;
            uVar4 = XXH64(pBVar10,local_58,0);
            uVar7 = (ulong)((uint)uVar4 & local_74);
            bVar6 = (byte)local_48->bucketSizeLog;
            pBVar3 = ldmState->bucketOffsets;
            bVar5 = pBVar3[uVar7];
            ldmState->hashTable[(uVar7 << (bVar6 & 0x3f)) + (ulong)bVar5] =
                 (ldmEntry_t)
                 ((ulong)(uint)((int)pBVar10 - (int)local_50) | uVar4 & 0xffffffff00000000);
            pBVar3[uVar7] = ~(byte)(-1 << (bVar6 & 0x1f)) & bVar5 + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < local_78);
      }
      ip = ip + local_68;
    } while (ip < local_70);
  }
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* ldmState, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U32 const minMatchLength = params->minMatchLength;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const istart = ip;
    ldmRollingHashState_t hashState;
    size_t* const splits = ldmState->splitIndices;
    unsigned numSplits;

    DEBUGLOG(5, "ZSTD_ldm_fillHashTable");

    ZSTD_ldm_gear_init(&hashState, params);
    while (ip < iend) {
        size_t hashed;
        unsigned n;

        numSplits = 0;
        hashed = ZSTD_ldm_gear_feed(&hashState, ip, iend - ip, splits, &numSplits);

        for (n = 0; n < numSplits; n++) {
            if (ip + splits[n] >= istart + minMatchLength) {
                BYTE const* const split = ip + splits[n] - minMatchLength;
                U64 const xxhash = XXH64(split, minMatchLength, 0);
                U32 const hash = (U32)(xxhash & (((U32)1 << hBits) - 1));
                ldmEntry_t entry;

                entry.offset = (U32)(split - base);
                entry.checksum = (U32)(xxhash >> 32);
                ZSTD_ldm_insertEntry(ldmState, hash, entry, *params);
            }
        }

        ip += hashed;
    }
}